

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printSSECC(MCInst *MI,uint Op,SStream *OS)

{
  MCOperand *op;
  int64_t iVar1;
  int64_t Imm;
  SStream *OS_local;
  uint Op_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,Op);
  iVar1 = MCOperand_getImm(op);
  switch((uint)iVar1 & 7) {
  case 0:
    SStream_concat0(OS,"eq");
    op_addSseCC(MI,1);
    break;
  case 1:
    SStream_concat0(OS,"lt");
    op_addSseCC(MI,2);
    break;
  case 2:
    SStream_concat0(OS,"le");
    op_addSseCC(MI,3);
    break;
  case 3:
    SStream_concat0(OS,"unord");
    op_addSseCC(MI,4);
    break;
  case 4:
    SStream_concat0(OS,"neq");
    op_addSseCC(MI,5);
    break;
  case 5:
    SStream_concat0(OS,"nlt");
    op_addSseCC(MI,6);
    break;
  case 6:
    SStream_concat0(OS,"nle");
    op_addSseCC(MI,7);
    break;
  case 7:
    SStream_concat0(OS,"ord");
    op_addSseCC(MI,8);
  }
  return;
}

Assistant:

static void printSSECC(MCInst *MI, unsigned Op, SStream *OS)
{
	int64_t Imm = MCOperand_getImm(MCInst_getOperand(MI, Op)) & 7;
	switch (Imm) {
		default: break;	// never reach
		case    0: SStream_concat0(OS, "eq"); op_addSseCC(MI, X86_SSE_CC_EQ); break;
		case    1: SStream_concat0(OS, "lt"); op_addSseCC(MI, X86_SSE_CC_LT); break;
		case    2: SStream_concat0(OS, "le"); op_addSseCC(MI, X86_SSE_CC_LE); break;
		case    3: SStream_concat0(OS, "unord"); op_addSseCC(MI, X86_SSE_CC_UNORD); break;
		case    4: SStream_concat0(OS, "neq"); op_addSseCC(MI, X86_SSE_CC_NEQ); break;
		case    5: SStream_concat0(OS, "nlt"); op_addSseCC(MI, X86_SSE_CC_NLT); break;
		case    6: SStream_concat0(OS, "nle"); op_addSseCC(MI, X86_SSE_CC_NLE); break;
		case    7: SStream_concat0(OS, "ord"); op_addSseCC(MI, X86_SSE_CC_ORD); break;
		case    8: SStream_concat0(OS, "eq_uq"); op_addSseCC(MI, X86_SSE_CC_EQ_UQ); break;
		case    9: SStream_concat0(OS, "nge"); op_addSseCC(MI, X86_SSE_CC_NGE); break;
		case  0xa: SStream_concat0(OS, "ngt"); op_addSseCC(MI, X86_SSE_CC_NGT); break;
		case  0xb: SStream_concat0(OS, "false"); op_addSseCC(MI, X86_SSE_CC_FALSE); break;
		case  0xc: SStream_concat0(OS, "neq_oq"); op_addSseCC(MI, X86_SSE_CC_NEQ_OQ); break;
		case  0xd: SStream_concat0(OS, "ge"); op_addSseCC(MI, X86_SSE_CC_GE); break;
		case  0xe: SStream_concat0(OS, "gt"); op_addSseCC(MI, X86_SSE_CC_GT); break;
		case  0xf: SStream_concat0(OS, "true"); op_addSseCC(MI, X86_SSE_CC_TRUE); break;
	}
}